

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5HighlightCb(void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  long lVar1;
  undefined4 in_ECX;
  uint in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_FS_OFFSET;
  int iPos;
  HighlightContext *p;
  int rc;
  int n;
  undefined4 in_stack_ffffffffffffffc8;
  int local_10;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  if ((in_ESI & 1) == 0) {
    n = in_RDI[0x14];
    in_RDI[0x14] = n + 1;
    if (-1 < in_RDI[1]) {
      if ((n < *in_RDI) || (in_RDI[1] < n)) {
        local_10 = 0;
        goto LAB_0028ee66;
      }
      if ((*in_RDI != 0) && (n == *in_RDI)) {
        in_RDI[0x15] = in_R8D;
      }
    }
    if ((in_RDI[0x16] != 0) &&
       (((n <= in_RDI[0x11] || (in_RDI[0x11] < 0)) && (in_RDI[0x15] < in_R8D)))) {
      fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                          (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (char *)in_RDI,n);
      in_RDI[0x16] = 0;
    }
    if ((n == in_RDI[0x11]) && (in_RDI[0x16] == 0)) {
      fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                          (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (char *)in_RDI,n);
      fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                          (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (char *)in_RDI,n);
      in_RDI[0x15] = in_R8D;
      in_RDI[0x16] = 1;
    }
    if (n == in_RDI[0x12]) {
      if (in_RDI[0x16] == 0) {
        fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                            (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                            (char *)in_RDI,n);
        in_RDI[0x16] = 1;
      }
      fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                          (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (char *)in_RDI,n);
      in_RDI[0x15] = in_R9D;
      local_c = fts5CInstIterNext((CInstIter *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8));
    }
    if (n == in_RDI[1]) {
      if (in_RDI[0x16] != 0) {
        if ((-1 < in_RDI[0x11]) && (in_RDI[0x11] <= n)) {
          fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                              (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                              (char *)in_RDI,n);
          in_RDI[0x15] = in_R9D;
        }
        fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                            (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                            (char *)in_RDI,n);
        in_RDI[0x16] = 0;
      }
      fts5HighlightAppend((int *)CONCAT44(in_ECX,in_R8D),
                          (HighlightContext *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                          (char *)in_RDI,n);
      in_RDI[0x15] = in_R9D;
    }
    local_10 = local_c;
  }
  else {
    local_10 = 0;
  }
LAB_0028ee66:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5HighlightCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start byte offset of token */
  int iEndOff                     /* End byte offset of token */
){
  HighlightContext *p = (HighlightContext*)pContext;
  int rc = SQLITE_OK;
  int iPos;

  UNUSED_PARAM2(pToken, nToken);

  if( tflags & FTS5_TOKEN_COLOCATED ) return SQLITE_OK;
  iPos = p->iPos++;

  if( p->iRangeEnd>=0 ){
    if( iPos<p->iRangeStart || iPos>p->iRangeEnd ) return SQLITE_OK;
    if( p->iRangeStart && iPos==p->iRangeStart ) p->iOff = iStartOff;
  }

  /* If the parenthesis is open, and this token is not part of the current
  ** phrase, and the starting byte offset of this token is past the point
  ** that has currently been copied into the output buffer, close the
  ** parenthesis. */
  if( p->bOpen
   && (iPos<=p->iter.iStart || p->iter.iStart<0)
   && iStartOff>p->iOff
  ){
    fts5HighlightAppend(&rc, p, p->zClose, -1);
    p->bOpen = 0;
  }

  /* If this is the start of a new phrase, and the highlight is not open:
  **
  **   * copy text from the input up to the start of the phrase, and
  **   * open the highlight.
  */
  if( iPos==p->iter.iStart && p->bOpen==0 ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iStartOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zOpen, -1);
    p->iOff = iStartOff;
    p->bOpen = 1;
  }

  if( iPos==p->iter.iEnd ){
    if( p->bOpen==0 ){
      assert( p->iRangeEnd>=0 );
      fts5HighlightAppend(&rc, p, p->zOpen, -1);
      p->bOpen = 1;
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;

    if( rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&p->iter);
    }
  }

  if( iPos==p->iRangeEnd ){
    if( p->bOpen ){
      if( p->iter.iStart>=0 && iPos>=p->iter.iStart ){
        fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
        p->iOff = iEndOff;
      }
      fts5HighlightAppend(&rc, p, p->zClose, -1);
      p->bOpen = 0;
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;
  }

  return rc;
}